

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uenum.cpp
# Opt level: O0

UChar * uenum_unextDefault_63(UEnumeration *en,int32_t *resultLength,UErrorCode *status)

{
  char *cs;
  char *cstr;
  UChar *pUStack_28;
  int32_t len;
  UChar *ustr;
  UErrorCode *status_local;
  int32_t *resultLength_local;
  UEnumeration *en_local;
  
  pUStack_28 = (UChar *)0x0;
  cstr._4_4_ = U_ZERO_ERROR;
  status_local = resultLength;
  if (en->next == (UEnumNext *)0x0) {
    *status = U_UNSUPPORTED_ERROR;
  }
  else {
    ustr = (UChar *)status;
    resultLength_local = (int32_t *)en;
    cs = (*en->next)(en,(int32_t *)((long)&cstr + 4),status);
    if (cs != (char *)0x0) {
      pUStack_28 = (UChar *)_getBuffer((UEnumeration *)resultLength_local,
                                       (cstr._4_4_ + U_ILLEGAL_ARGUMENT_ERROR) * 2);
      if (pUStack_28 == (UChar *)0x0) {
        ustr[0] = L'\a';
        ustr[1] = L'\0';
      }
      else {
        u_charsToUChars_63(cs,pUStack_28,cstr._4_4_ + U_ILLEGAL_ARGUMENT_ERROR);
      }
    }
  }
  if (status_local != (UErrorCode *)0x0) {
    *status_local = cstr._4_4_;
  }
  return pUStack_28;
}

Assistant:

U_CAPI const UChar* U_EXPORT2
uenum_unextDefault(UEnumeration* en,
            int32_t* resultLength,
            UErrorCode* status)
{
    UChar *ustr = NULL;
    int32_t len = 0;
    if (en->next != NULL) {
        const char *cstr = en->next(en, &len, status);
        if (cstr != NULL) {
            ustr = (UChar*) _getBuffer(en, (len+1) * sizeof(UChar));
            if (ustr == NULL) {
                *status = U_MEMORY_ALLOCATION_ERROR;
            } else {
                u_charsToUChars(cstr, ustr, len+1);
            }
        }
    } else {
        *status = U_UNSUPPORTED_ERROR;
    }
    if (resultLength) {
        *resultLength = len;
    }
    return ustr;
}